

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::MapReflectionTester::SetMapFieldsViaMapReflection
          (MapReflectionTester *this,Message *message)

{
  bool bVar1;
  int iVar2;
  Reflection *pRVar3;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  Message *pMVar6;
  Reflection *this_00;
  char *in_R9;
  string_view sVar7;
  string local_ce0;
  AssertHelper local_cc0;
  Message local_cb8;
  string_view local_cb0;
  bool local_c99;
  undefined1 local_c98 [8];
  AssertionResult gtest_ar__29;
  string local_c78 [32];
  string_view local_c58;
  string_view local_c48;
  string local_c38 [32];
  string_view local_c18;
  string_view local_c08;
  string_view local_bf8;
  string local_be8 [32];
  string_view local_bc8;
  string_view local_bb8;
  string_view local_ba8;
  string_view local_b98;
  string_view local_b88;
  string_view local_b78;
  string_view local_b68;
  string_view local_b58;
  string_view local_b48;
  string_view local_b38;
  string_view local_b28;
  string local_b18;
  AssertHelper local_af8;
  Message local_af0;
  string_view local_ae8;
  bool local_ad1;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_aa0;
  Message local_a98;
  string_view local_a90;
  bool local_a79;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_a48;
  Message local_a40;
  string_view local_a38;
  bool local_a21;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_9f0;
  Message local_9e8;
  string_view local_9e0;
  bool local_9c9;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_998;
  Message local_990;
  string_view local_988;
  bool local_971;
  undefined1 local_970 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_940;
  Message local_938;
  string_view local_930;
  bool local_919;
  undefined1 local_918 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_8e8;
  Message local_8e0;
  string_view local_8d8;
  bool local_8c1;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_890;
  Message local_888;
  string_view local_880;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar__21;
  string local_828;
  AssertHelper local_808;
  Message local_800;
  string_view local_7f8;
  bool local_7e1;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_7b0;
  Message local_7a8;
  string_view local_7a0;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar__19;
  string local_748;
  AssertHelper local_728;
  Message local_720;
  string_view local_718;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_6d0;
  Message local_6c8;
  string_view local_6c0;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__17;
  string local_688 [32];
  string local_668;
  AssertHelper local_648;
  Message local_640;
  string_view local_638;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_5f0;
  Message local_5e8;
  string_view local_5e0;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_598;
  Message local_590;
  string_view local_588;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_540;
  Message local_538;
  string_view local_530;
  bool local_519;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_4e8;
  Message local_4e0;
  string_view local_4d8;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_490;
  Message local_488;
  string_view local_480;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_438;
  Message local_430;
  string_view local_428;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_3e0;
  Message local_3d8;
  string_view local_3d0;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_388;
  Message local_380;
  string_view local_378;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_330;
  Message local_328;
  string_view local_320;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2d8;
  Message local_2d0;
  string_view local_2c8;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_280;
  Message local_278;
  string_view local_270;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_228;
  Message local_220;
  string_view local_218;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d0;
  Message local_1c8;
  string_view local_1c0;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_178;
  Message local_170;
  string_view local_168;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_120;
  Message local_118;
  string_view local_110;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  Message local_c0;
  string_view local_b8;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_80 [8];
  MapKey map_key;
  string map_key_string;
  MapValueConstRef map_val_const;
  MapValueRef map_val;
  Message *sub_foreign_message;
  Reflection *reflection;
  Message *message_local;
  MapReflectionTester *this_local;
  
  pRVar3 = Message::GetReflection(message);
  MapValueRef::MapValueRef((MapValueRef *)&map_val_const.type_);
  MapValueConstRef::MapValueConstRef((MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  std::__cxx11::string::string((string *)&map_key.type_);
  MapKey::MapKey((MapKey *)local_80);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,"map_int32_int32");
  pFVar4 = F(this,local_b8);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_a0,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int32_int32\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x19a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"map_int32_int32");
  pFVar4 = F(this,local_110);
  local_f9 = Reflection::InsertOrLookupMapValue
                       (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_
                       );
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_f8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_int32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x19c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  MapValueRef::SetInt32Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetInt64Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,"map_int64_int64");
  pFVar4 = F(this,local_168);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_151 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_150,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int64_int64\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1a1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c0,"map_int64_int64");
  pFVar4 = F(this,local_1c0);
  local_1a9 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1a8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int64_int64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1a3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  MapValueRef::SetInt64Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetUInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_218,"map_uint32_uint32");
  pFVar4 = F(this,local_218);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_201 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_200,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_uint32_uint32\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1a8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_270,"map_uint32_uint32");
  pFVar4 = F(this,local_270);
  local_259 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_258,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_uint32_uint32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1aa,pcVar5);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  MapValueRef::SetUInt32Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetUInt64Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,"map_uint64_uint64");
  pFVar4 = F(this,local_2c8);
  local_2b1 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2b0,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_uint64_uint64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1af,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  MapValueRef::SetUInt64Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_320,"map_sint32_sint32");
  pFVar4 = F(this,local_320);
  local_309 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_308,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sint32_sint32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1b4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  MapValueRef::SetInt32Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetInt64Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_378,"map_sint64_sint64");
  pFVar4 = F(this,local_378);
  local_361 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_360,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sint64_sint64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1b9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  MapValueRef::SetInt64Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetUInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3d0,"map_fixed32_fixed32");
  pFVar4 = F(this,local_3d0);
  local_3b9 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_3b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_fixed32_fixed32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  MapValueRef::SetUInt32Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetUInt64Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_428,"map_fixed64_fixed64");
  pFVar4 = F(this,local_428);
  local_411 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_410,&local_411,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_410,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_fixed64_fixed64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1c3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  MapValueRef::SetUInt64Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_480,"map_sfixed32_sfixed32");
  pFVar4 = F(this,local_480);
  local_469 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_468,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sfixed32_sfixed32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1c8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  MapValueRef::SetInt32Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetInt64Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4d8,"map_sfixed64_sfixed64");
  pFVar4 = F(this,local_4d8);
  local_4c1 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_4c0,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sfixed64_sfixed64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1cd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  MapValueRef::SetInt64Value((MapValueRef *)&map_val_const.type_,0);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_530,"map_int32_float");
  pFVar4 = F(this,local_530);
  local_519 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_518,&local_519,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_518,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_float\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1d2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  MapValueRef::SetFloatValue((MapValueRef *)&map_val_const.type_,0.0);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_588,"map_int32_double");
  pFVar4 = F(this,local_588);
  local_571 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_570,&local_571,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_570,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_double\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1d7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  MapValueRef::SetDoubleValue((MapValueRef *)&map_val_const.type_,0.0);
  MapKey::SetBoolValue((MapKey *)local_80,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5e0,"map_bool_bool");
  pFVar4 = F(this,local_5e0);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_5c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_5c8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_bool_bool\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1dc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_638,"map_bool_bool");
  pFVar4 = F(this,local_638);
  local_621 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_620,&local_621,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_668,(internal *)local_620,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_bool_bool\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1de,pcVar5);
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  MapValueRef::SetBoolValue((MapValueRef *)&map_val_const.type_,false);
  long_string_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&map_key.type_,local_688);
  std::__cxx11::string::~string(local_688);
  sVar7 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&map_key.type_);
  gtest_ar__17.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )sVar7._M_len;
  MapKey::SetStringValue((MapKey *)local_80,sVar7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6c0,"map_string_string");
  pFVar4 = F(this,local_6c0);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_6a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_6a8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_string_string\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1e4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_718,"map_string_string");
  pFVar4 = F(this,local_718);
  local_701 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_700,&local_701,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_748,(internal *)local_700,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_string_string\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1e6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_728,&local_720);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    std::__cxx11::string::~string((string *)&local_748);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  long_string_abi_cxx11_();
  sVar7 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&gtest_ar__19.message_)
  ;
  MapValueRef::SetStringValue((MapValueRef *)&map_val_const.type_,sVar7);
  std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_7a0,"map_int32_bytes");
  pFVar4 = F(this,local_7a0);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_789 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_788,&local_789,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_788,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int32_bytes\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1eb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_7f8,"map_int32_bytes");
  pFVar4 = F(this,local_7f8);
  local_7e1 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7e0,&local_7e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_828,(internal *)local_7e0,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_bytes\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1ed,pcVar5);
    testing::internal::AssertHelper::operator=(&local_808,&local_800);
    testing::internal::AssertHelper::~AssertHelper(&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  long_string_abi_cxx11_();
  sVar7 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&gtest_ar__21.message_)
  ;
  MapValueRef::SetStringValue((MapValueRef *)&map_val_const.type_,sVar7);
  std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_880,"map_int32_enum");
  pFVar4 = F(this,local_880);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_869 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_868,&local_869,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_868,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int32_enum\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1f2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_890,&local_888);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8d8,"map_int32_enum");
  pFVar4 = F(this,local_8d8);
  local_8c1 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8c0,&local_8c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_8c0,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_enum\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,500,pcVar5);
    testing::internal::AssertHelper::operator=(&local_8e8,&local_8e0);
    testing::internal::AssertHelper::~AssertHelper(&local_8e8);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  iVar2 = EnumValueDescriptor::number(this->map_enum_bar_);
  MapValueRef::SetEnumValue((MapValueRef *)&map_val_const.type_,iVar2);
  MapKey::SetInt32Value((MapKey *)local_80,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_930,"map_int32_foreign_message");
  pFVar4 = F(this,local_930);
  bVar1 = Reflection::LookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,
                     (MapValueConstRef *)((long)&map_key_string.field_2 + 8));
  local_919 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_918,&local_919,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_918,
               (AssertionResult *)
               "reflection->LookupMapValue( *message, F(\"map_int32_foreign_message\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1f9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_940,&local_938);
    testing::internal::AssertHelper::~AssertHelper(&local_940);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_988,"map_int32_foreign_message");
  pFVar4 = F(this,local_988);
  local_971 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_970,&local_971,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_990);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_970,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_int32_foreign_message\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1fb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  pMVar6 = MapValueRef::MutableMessageValue((MapValueRef *)&map_val_const.type_);
  this_00 = Message::GetReflection(pMVar6);
  Reflection::SetInt32(this_00,pMVar6,this->foreign_c_,0);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9e0,"map_int32_int32");
  pFVar4 = F(this,local_9e0);
  local_9c9 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c8,&local_9c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_9c8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_int32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x203,pcVar5);
    testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper(&local_9f0);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  MapValueRef::SetInt32Value((MapValueRef *)&map_val_const.type_,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a38,"map_int32_int32");
  pFVar4 = F(this,local_a38);
  bVar1 = Reflection::InsertOrLookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  local_a21 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a20,&local_a21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a20);
  if (!bVar1) {
    testing::Message::Message(&local_a40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_a20,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_int32\"), map_key, &map_val)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x206,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a48,&local_a40);
    testing::internal::AssertHelper::~AssertHelper(&local_a48);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_a40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
  MapKey::SetInt64Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a90,"map_int64_int64");
  pFVar4 = F(this,local_a90);
  local_a79 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a78,&local_a79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_a78,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int64_int64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x20a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
  MapValueRef::SetInt64Value((MapValueRef *)&map_val_const.type_,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ae8,"map_int64_int64");
  pFVar4 = F(this,local_ae8);
  bVar1 = Reflection::InsertOrLookupMapValue
                    (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  local_ad1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ad0,&local_ad1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar1) {
    testing::Message::Message(&local_af0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b18,(internal *)local_ad0,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int64_int64\"), map_key, &map_val)"
               ,"true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_af8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x20d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_af8,&local_af0);
    testing::internal::AssertHelper::~AssertHelper(&local_af8);
    std::__cxx11::string::~string((string *)&local_b18);
    testing::Message::~Message(&local_af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  MapKey::SetUInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b28,"map_uint32_uint32");
  pFVar4 = F(this,local_b28);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetUInt32Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetUInt64Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b38,"map_uint64_uint64");
  pFVar4 = F(this,local_b38);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetUInt64Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b48,"map_sint32_sint32");
  pFVar4 = F(this,local_b48);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetInt32Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetInt64Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b58,"map_sint64_sint64");
  pFVar4 = F(this,local_b58);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetInt64Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetUInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b68,"map_fixed32_fixed32");
  pFVar4 = F(this,local_b68);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetUInt32Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetUInt64Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b78,"map_fixed64_fixed64");
  pFVar4 = F(this,local_b78);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetUInt64Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b88,"map_sfixed32_sfixed32");
  pFVar4 = F(this,local_b88);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetInt32Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetInt64Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b98,"map_sfixed64_sfixed64");
  pFVar4 = F(this,local_b98);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetInt64Value((MapValueRef *)&map_val_const.type_,1);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ba8,"map_int32_float");
  pFVar4 = F(this,local_ba8);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetFloatValue((MapValueRef *)&map_val_const.type_,1.0);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_bb8,"map_int32_double");
  pFVar4 = F(this,local_bb8);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetDoubleValue((MapValueRef *)&map_val_const.type_,1.0);
  MapKey::SetBoolValue((MapKey *)local_80,true);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_bc8,"map_bool_bool");
  pFVar4 = F(this,local_bc8);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  MapValueRef::SetBoolValue((MapValueRef *)&map_val_const.type_,true);
  long_string_2_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&map_key.type_,local_be8);
  std::__cxx11::string::~string(local_be8);
  local_bf8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&map_key.type_);
  MapKey::SetStringValue((MapKey *)local_80,local_bf8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c08,"map_string_string");
  pFVar4 = F(this,local_c08);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  long_string_2_abi_cxx11_();
  local_c18 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c38);
  MapValueRef::SetStringValue((MapValueRef *)&map_val_const.type_,local_c18);
  std::__cxx11::string::~string(local_c38);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c48,"map_int32_bytes");
  pFVar4 = F(this,local_c48);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  long_string_2_abi_cxx11_();
  local_c58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c78);
  MapValueRef::SetStringValue((MapValueRef *)&map_val_const.type_,local_c58);
  std::__cxx11::string::~string(local_c78);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__29.message_,
             "map_int32_enum");
  pFVar4 = F(this,stack0xfffffffffffff378);
  Reflection::InsertOrLookupMapValue
            (pRVar3,message,pFVar4,(MapKey *)local_80,(MapValueRef *)&map_val_const.type_);
  iVar2 = EnumValueDescriptor::number(this->map_enum_baz_);
  MapValueRef::SetEnumValue((MapValueRef *)&map_val_const.type_,iVar2);
  MapKey::SetInt32Value((MapKey *)local_80,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_cb0,"map_int32_foreign_message");
  pFVar4 = F(this,local_cb0);
  local_c99 = Reflection::InsertOrLookupMapValue
                        (pRVar3,message,pFVar4,(MapKey *)local_80,
                         (MapValueRef *)&map_val_const.type_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c98,&local_c99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c98);
  if (!bVar1) {
    testing::Message::Message(&local_cb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ce0,(internal *)local_c98,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_int32_foreign_message\"), map_key, &map_val)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,600,pcVar5);
    testing::internal::AssertHelper::operator=(&local_cc0,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_cc0);
    std::__cxx11::string::~string((string *)&local_ce0);
    testing::Message::~Message(&local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c98);
  pMVar6 = MapValueRef::MutableMessageValue((MapValueRef *)&map_val_const.type_);
  pRVar3 = Message::GetReflection(pMVar6);
  Reflection::SetInt32(pRVar3,pMVar6,this->foreign_c_,1);
  std::__cxx11::string::~string((string *)&map_key.type_);
  return;
}

Assistant:

void MapReflectionTester::SetMapFieldsViaMapReflection(Message* message) {
  const Reflection* reflection = message->GetReflection();

  Message* sub_foreign_message = nullptr;
  MapValueRef map_val;
  MapValueConstRef map_val_const;

  // Add first element.
  std::string map_key_string;
  MapKey map_key;
  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int32_int32"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_int32"),
                                                 map_key, &map_val));
  map_val.SetInt32Value(0);

  map_key.SetInt64Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int64_int64"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int64_int64"),
                                                 map_key, &map_val));
  map_val.SetInt64Value(0);

  map_key.SetUInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_uint32_uint32"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_uint32_uint32"), map_key, &map_val));
  map_val.SetUInt32Value(0);

  map_key.SetUInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_uint64_uint64"), map_key, &map_val));
  map_val.SetUInt64Value(0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sint32_sint32"), map_key, &map_val));
  map_val.SetInt32Value(0);

  map_key.SetInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sint64_sint64"), map_key, &map_val));
  map_val.SetInt64Value(0);

  map_key.SetUInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_fixed32_fixed32"), map_key, &map_val));
  map_val.SetUInt32Value(0);

  map_key.SetUInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_fixed64_fixed64"), map_key, &map_val));
  map_val.SetUInt64Value(0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sfixed32_sfixed32"), map_key, &map_val));
  map_val.SetInt32Value(0);

  map_key.SetInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sfixed64_sfixed64"), map_key, &map_val));
  map_val.SetInt64Value(0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_float"),
                                                 map_key, &map_val));
  map_val.SetFloatValue(0.0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_double"),
                                                 map_key, &map_val));
  map_val.SetDoubleValue(0.0);

  map_key.SetBoolValue(false);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_bool_bool"), map_key,
                                          &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_bool_bool"),
                                                 map_key, &map_val));
  map_val.SetBoolValue(false);

  map_key_string = long_string();
  map_key.SetStringValue(map_key_string);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_string_string"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_string_string"), map_key, &map_val));
  map_val.SetStringValue(long_string());

  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int32_bytes"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_bytes"),
                                                 map_key, &map_val));
  map_val.SetStringValue(long_string());

  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int32_enum"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_enum"),
                                                 map_key, &map_val));
  map_val.SetEnumValue(map_enum_bar_->number());

  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(
      *message, F("map_int32_foreign_message"), map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_int32_foreign_message"), map_key, &map_val));
  sub_foreign_message = map_val.MutableMessageValue();
  sub_foreign_message->GetReflection()->SetInt32(sub_foreign_message,
                                                 foreign_c_, 0);

  // Add second element
  map_key.SetInt32Value(1);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_int32"),
                                                 map_key, &map_val));
  map_val.SetInt32Value(1);
  EXPECT_FALSE(reflection->InsertOrLookupMapValue(message, F("map_int32_int32"),
                                                  map_key, &map_val));

  map_key.SetInt64Value(1);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int64_int64"),
                                                 map_key, &map_val));
  map_val.SetInt64Value(1);
  EXPECT_FALSE(reflection->InsertOrLookupMapValue(message, F("map_int64_int64"),
                                                  map_key, &map_val));

  map_key.SetUInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_uint32_uint32"), map_key,
                                     &map_val);
  map_val.SetUInt32Value(1);

  map_key.SetUInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_uint64_uint64"), map_key,
                                     &map_val);
  map_val.SetUInt64Value(1);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sint32_sint32"), map_key,
                                     &map_val);
  map_val.SetInt32Value(1);

  map_key.SetInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sint64_sint64"), map_key,
                                     &map_val);
  map_val.SetInt64Value(1);

  map_key.SetUInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_fixed32_fixed32"), map_key,
                                     &map_val);
  map_val.SetUInt32Value(1);

  map_key.SetUInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_fixed64_fixed64"), map_key,
                                     &map_val);
  map_val.SetUInt64Value(1);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sfixed32_sfixed32"),
                                     map_key, &map_val);
  map_val.SetInt32Value(1);

  map_key.SetInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sfixed64_sfixed64"),
                                     map_key, &map_val);
  map_val.SetInt64Value(1);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_float"), map_key,
                                     &map_val);
  map_val.SetFloatValue(1.0);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_double"), map_key,
                                     &map_val);
  map_val.SetDoubleValue(1.0);

  map_key.SetBoolValue(true);
  reflection->InsertOrLookupMapValue(message, F("map_bool_bool"), map_key,
                                     &map_val);
  map_val.SetBoolValue(true);

  map_key_string = long_string_2();
  map_key.SetStringValue(map_key_string);
  reflection->InsertOrLookupMapValue(message, F("map_string_string"), map_key,
                                     &map_val);
  map_val.SetStringValue(long_string_2());

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_bytes"), map_key,
                                     &map_val);
  map_val.SetStringValue(long_string_2());

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_enum"), map_key,
                                     &map_val);
  map_val.SetEnumValue(map_enum_baz_->number());

  map_key.SetInt32Value(1);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_int32_foreign_message"), map_key, &map_val));
  sub_foreign_message = map_val.MutableMessageValue();
  sub_foreign_message->GetReflection()->SetInt32(sub_foreign_message,
                                                 foreign_c_, 1);
}